

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.c
# Opt level: O1

_Bool is_matching_txid(wally_tx *tx,uchar *txid,size_t txid_len)

{
  int iVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  uchar src_txid [32];
  uchar local_28;
  uchar uStack_27;
  uchar uStack_26;
  uchar uStack_25;
  uchar uStack_24;
  uchar uStack_23;
  uchar uStack_22;
  uchar uStack_21;
  uchar uStack_20;
  uchar uStack_1f;
  uchar uStack_1e;
  uchar uStack_1d;
  uchar uStack_1c;
  uchar uStack_1b;
  uchar uStack_1a;
  uchar uStack_19;
  uchar local_18;
  uchar uStack_17;
  uchar uStack_16;
  uchar uStack_15;
  uchar uStack_14;
  uchar uStack_13;
  uchar uStack_12;
  uchar uStack_11;
  uchar uStack_10;
  uchar uStack_f;
  uchar uStack_e;
  uchar uStack_d;
  uchar uStack_c;
  uchar uStack_b;
  uchar uStack_a;
  uchar uStack_9;
  
  if ((txid != (uchar *)0x0 && tx != (wally_tx *)0x0) &&
     (iVar1 = wally_tx_get_txid(tx,&local_28,0x20), iVar1 == 0)) {
    auVar3[0] = -(txid[0x10] == local_18);
    auVar3[1] = -(txid[0x11] == uStack_17);
    auVar3[2] = -(txid[0x12] == uStack_16);
    auVar3[3] = -(txid[0x13] == uStack_15);
    auVar3[4] = -(txid[0x14] == uStack_14);
    auVar3[5] = -(txid[0x15] == uStack_13);
    auVar3[6] = -(txid[0x16] == uStack_12);
    auVar3[7] = -(txid[0x17] == uStack_11);
    auVar3[8] = -(txid[0x18] == uStack_10);
    auVar3[9] = -(txid[0x19] == uStack_f);
    auVar3[10] = -(txid[0x1a] == uStack_e);
    auVar3[0xb] = -(txid[0x1b] == uStack_d);
    auVar3[0xc] = -(txid[0x1c] == uStack_c);
    auVar3[0xd] = -(txid[0x1d] == uStack_b);
    auVar3[0xe] = -(txid[0x1e] == uStack_a);
    auVar3[0xf] = -(txid[0x1f] == uStack_9);
    auVar2[0] = -(*txid == local_28);
    auVar2[1] = -(txid[1] == uStack_27);
    auVar2[2] = -(txid[2] == uStack_26);
    auVar2[3] = -(txid[3] == uStack_25);
    auVar2[4] = -(txid[4] == uStack_24);
    auVar2[5] = -(txid[5] == uStack_23);
    auVar2[6] = -(txid[6] == uStack_22);
    auVar2[7] = -(txid[7] == uStack_21);
    auVar2[8] = -(txid[8] == uStack_20);
    auVar2[9] = -(txid[9] == uStack_1f);
    auVar2[10] = -(txid[10] == uStack_1e);
    auVar2[0xb] = -(txid[0xb] == uStack_1d);
    auVar2[0xc] = -(txid[0xc] == uStack_1c);
    auVar2[0xd] = -(txid[0xd] == uStack_1b);
    auVar2[0xe] = -(txid[0xe] == uStack_1a);
    auVar2[0xf] = -(txid[0xf] == uStack_19);
    auVar2 = auVar2 & auVar3;
    wally_clear(&local_28,0x20);
    return (ushort)((ushort)(SUB161(auVar2 >> 7,0) & 1) | (ushort)(SUB161(auVar2 >> 0xf,0) & 1) << 1
                    | (ushort)(SUB161(auVar2 >> 0x17,0) & 1) << 2 |
                    (ushort)(SUB161(auVar2 >> 0x1f,0) & 1) << 3 |
                    (ushort)(SUB161(auVar2 >> 0x27,0) & 1) << 4 |
                    (ushort)(SUB161(auVar2 >> 0x2f,0) & 1) << 5 |
                    (ushort)(SUB161(auVar2 >> 0x37,0) & 1) << 6 |
                    (ushort)(SUB161(auVar2 >> 0x3f,0) & 1) << 7 |
                    (ushort)(SUB161(auVar2 >> 0x47,0) & 1) << 8 |
                    (ushort)(SUB161(auVar2 >> 0x4f,0) & 1) << 9 |
                    (ushort)(SUB161(auVar2 >> 0x57,0) & 1) << 10 |
                    (ushort)(SUB161(auVar2 >> 0x5f,0) & 1) << 0xb |
                    (ushort)(SUB161(auVar2 >> 0x67,0) & 1) << 0xc |
                    (ushort)(SUB161(auVar2 >> 0x6f,0) & 1) << 0xd |
                    (ushort)(SUB161(auVar2 >> 0x77,0) & 1) << 0xe |
                   (ushort)(byte)(auVar2[0xf] >> 7) << 0xf) == 0xffff;
  }
  return false;
}

Assistant:

static bool is_matching_txid(const struct wally_tx *tx,
                             const unsigned char *txid, size_t txid_len)
{
    unsigned char src_txid[WALLY_TXHASH_LEN];
    bool ret;

    if (!tx || !txid || txid_len != WALLY_TXHASH_LEN)
        return false;

    if (wally_tx_get_txid(tx, src_txid, sizeof(src_txid)) != WALLY_OK)
        return false;

    ret = memcmp(src_txid, txid, txid_len) == 0;
    wally_clear(src_txid, sizeof(src_txid));
    return ret;
}